

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::XMLReader::xcodeMoreChars
          (XMLReader *this,XMLCh *bufToFill,uchar *charSizes,XMLSize_t maxChars)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  XMLSize_t XVar5;
  XMLSize_t bytesEaten;
  long local_40;
  XMLSize_t local_38;
  
  local_40 = 0;
  bVar1 = false;
  local_38 = maxChars;
  do {
    XVar5 = this->fRawBufIndex;
    uVar4 = this->fRawBytesAvail - XVar5;
    if (((bVar1) || (this->fRawBytesAvail == XVar5)) || (uVar3 = uVar4, uVar4 < this->fLowWaterMark)
       ) {
      refreshRawBuffer(this);
      if (this->fRawBytesAvail == 0) {
        return 0;
      }
      XVar5 = this->fRawBufIndex;
      uVar3 = this->fRawBytesAvail - XVar5;
      if ((bool)(bVar1 & uVar4 == uVar3)) {
        return 0;
      }
    }
    iVar2 = (*this->fTranscoder->_vptr_XMLTranscoder[2])
                      (this->fTranscoder,this->fRawByteBuf + XVar5,uVar3,bufToFill,local_38,
                       &local_40,charSizes);
    bVar1 = true;
    if (local_40 != 0) {
      this->fRawBufIndex = this->fRawBufIndex + local_40;
      return CONCAT44(extraout_var,iVar2);
    }
  } while( true );
}

Assistant:

XMLSize_t
XMLReader::xcodeMoreChars(          XMLCh* const            bufToFill
                            ,       unsigned char* const    charSizes
                            , const XMLSize_t               maxChars)
{
    XMLSize_t charsDone = 0;
    XMLSize_t bytesEaten = 0;
    bool needMode = false;

    while (!bytesEaten)
    {
        // If our raw buffer is low, then lets load up another batch of
        // raw bytes now.
        //
        XMLSize_t bytesLeft = fRawBytesAvail - fRawBufIndex;
        if (needMode || bytesLeft == 0 || bytesLeft < fLowWaterMark)
        {
            refreshRawBuffer();

            // If there are no characters or if we need more but didn't get
            // any, return zero now.
            //
            if (fRawBytesAvail == 0 ||
                (needMode && (bytesLeft == fRawBytesAvail - fRawBufIndex)))
                return 0;
        }

        // Ask the transcoder to internalize another batch of chars. It is
        // possible that there is data in the raw buffer but the transcoder
        // is unable to produce anything because transcoding of multi-byte
        // encodings may have left a few bytes representing a partial
        // character in the buffer that can't be used until the next chunk
        // (and the rest of the character) is read. In this case set the
        // needMore flag and try again.
        //

        charsDone = fTranscoder->transcodeFrom
          (
            &fRawByteBuf[fRawBufIndex]
            , fRawBytesAvail - fRawBufIndex
            , bufToFill
            , maxChars
            , bytesEaten
            , charSizes
          );

        if (bytesEaten == 0)
            needMode = true;
        else
            fRawBufIndex += bytesEaten;
    }

    return charsDone;
}